

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O2

bool vera::loadModel(string *_filename,Model *_model)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_f9;
  string local_f8;
  string warn;
  string err;
  string ext;
  TinyGLTF loader;
  
  loader.load_image_user_data_ = &loader.fs;
  loader.is_binary_ = false;
  loader.serialize_default_values_ = false;
  loader.bin_data_ = (uchar *)0x0;
  loader.bin_size_ = 0;
  loader.fs.FileExists = tinygltf::FileExists;
  loader.fs.ExpandFilePath = tinygltf::ExpandFilePath;
  loader.fs.ReadWholeFile = tinygltf::ReadWholeFile;
  loader.fs.WriteWholeFile = tinygltf::WriteWholeFile;
  loader.fs.user_data = (void *)0x0;
  loader.LoadImageData = tinygltf::LoadImageData;
  loader.WriteImageData = tinygltf::WriteImageData;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  loader.write_image_user_data_ = loader.load_image_user_data_;
  getExt(&ext,_filename);
  bVar1 = std::operator==(&ext,"glb");
  if (!bVar1) {
    bVar1 = std::operator==(&ext,"GLB");
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_f8,(_filename->_M_dataplus)._M_p,&local_f9);
      bVar1 = tinygltf::TinyGLTF::LoadASCIIFromFile(&loader,_model,&err,&warn,&local_f8,1);
      goto LAB_002831b7;
    }
  }
  std::__cxx11::string::string((string *)&local_f8,(_filename->_M_dataplus)._M_p,&local_f9);
  bVar1 = tinygltf::TinyGLTF::LoadBinaryFromFile(&loader,_model,&err,&warn,&local_f8,1);
LAB_002831b7:
  std::__cxx11::string::~string((string *)&local_f8);
  if (warn._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Warn: ");
    poVar2 = std::operator<<(poVar2,warn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (err._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"ERR: ");
    poVar2 = std::operator<<(poVar2,err._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&ext);
  std::__cxx11::string::~string((string *)&warn);
  std::__cxx11::string::~string((string *)&err);
  return bVar1;
}

Assistant:

bool loadModel(const std::string& _filename, tinygltf::Model& _model) {
    tinygltf::TinyGLTF loader;
    std::string err;
    std::string warn;
    std::string ext = getExt(_filename);

    bool res = false;

    // assume binary glTF.
    if (ext == "glb" || ext == "GLB")
        res = loader.LoadBinaryFromFile(&_model, &err, &warn, _filename.c_str());

    // assume ascii glTF.
    else
        res = loader.LoadASCIIFromFile(&_model, &err, &warn, _filename.c_str());

    if (!warn.empty())
        std::cout << "Warn: " << warn.c_str() << std::endl;

    if (!err.empty())
        std::cout << "ERR: " << err.c_str() << std::endl;

    return res;
}